

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit_reporter.h
# Opt level: O2

void __thiscall bandit::detail::xunit_reporter::it_starting(xunit_reporter *this,char *desc)

{
  int *piVar1;
  ostream *poVar2;
  allocator local_69;
  string local_68;
  string local_48;
  
  piVar1 = &(this->super_progress_reporter).specs_run_;
  *piVar1 = *piVar1 + 1;
  poVar2 = std::operator<<((ostream *)&this->field_0x80,"\t<testcase classname=\"");
  progress_reporter::current_context_name_abi_cxx11_(&local_48,&this->super_progress_reporter);
  escape(&local_68,this,&local_48);
  poVar2 = std::operator<<(poVar2,(string *)&local_68);
  std::operator<<(poVar2,"\" ");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  poVar2 = std::operator<<((ostream *)&this->field_0x80,"name=\"");
  std::__cxx11::string::string((string *)&local_48,desc,&local_69);
  escape(&local_68,this,&local_48);
  poVar2 = std::operator<<(poVar2,(string *)&local_68);
  std::operator<<(poVar2,"\" time=\"0\">\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void it_starting(const char* desc)
    {
      progress_reporter::it_starting(desc);
      work_stm_ << "\t<testcase classname=\"" << escape(current_context_name()) << "\" ";
      work_stm_ << "name=\"" << escape(desc) << "\" time=\"0\">\n";
    }